

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

ssize_t add_to_tmp_buffer(FFSBuffer buf,size_t size)

{
  void *pvVar1;
  void *pvVar2;
  long in_RSI;
  long *in_RDI;
  int64_t tmp_size;
  ssize_t old_size;
  size_t in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  long local_8;
  
  local_8 = in_RDI[2];
  pvVar1 = (void *)(local_8 + in_RSI);
  if (in_RDI[1] < 0) {
    if ((void *)-in_RDI[1] < pvVar1) {
      return -1;
    }
  }
  else {
    if (in_RDI[1] == 0) {
      in_stack_ffffffffffffffd0 = pvVar1;
      if (pvVar1 < (void *)0x400) {
        in_stack_ffffffffffffffd0 = (void *)0x400;
      }
      pvVar2 = ffs_malloc((size_t)in_stack_ffffffffffffffd0);
      *in_RDI = (long)pvVar2;
    }
    if ((void *)in_RDI[1] < pvVar1) {
      pvVar2 = ffs_realloc(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      *in_RDI = (long)pvVar2;
      in_RDI[1] = (long)pvVar1;
    }
  }
  if (*in_RDI == 0) {
    in_RDI[1] = 0;
    local_8 = -1;
  }
  else {
    in_RDI[2] = (long)pvVar1;
  }
  return local_8;
}

Assistant:

static
ssize_t
add_to_tmp_buffer(FFSBuffer buf, size_t size)
{
    ssize_t old_size = buf->tmp_buffer_in_use_size;
    size += old_size;

    if (buf->tmp_buffer_size < 0) {
	/* fixed size buffer */
	if (size > (size_t)(-buf->tmp_buffer_size)) return -1;
    } else {
	if (buf->tmp_buffer_size == 0) {
	    int64_t tmp_size = Max(size, TMP_BUFFER_INIT_SIZE);
	    buf->tmp_buffer = malloc(tmp_size);
	}
	if (size > (size_t)buf->tmp_buffer_size) {
	    buf->tmp_buffer = realloc(buf->tmp_buffer, size);
	    buf->tmp_buffer_size = size;
	}
    }
    if (!buf->tmp_buffer) {
	buf->tmp_buffer_size = 0;
	return -1;
    } else {
	buf->tmp_buffer_in_use_size = size;
    }

    return old_size;
}